

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O2

_Bool tool_create_output_file(OutStruct *outs,OperationConfig *config)

{
  GlobalConfig *config_00;
  int __fd;
  int *piVar1;
  size_t __n;
  FILE *pFVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  
  pcVar5 = outs->filename;
  config_00 = config->global;
  if ((config->file_clobber_mode == CLOBBER_ALWAYS) ||
     ((config->file_clobber_mode == CLOBBER_DEFAULT && (outs->is_cd_filename != true)))) {
    pFVar2 = fopen64(pcVar5,"wb");
    if (pFVar2 != (FILE *)0x0) {
LAB_0010c1e5:
      outs->s_isreg = true;
      outs->fopened = true;
      outs->stream = (FILE *)pFVar2;
      outs->bytes = 0;
      outs->init = 0;
      return true;
    }
  }
  else {
    do {
      __fd = open64(pcVar5,0xc1,0x1b6);
      if (__fd != -1) goto LAB_0010c1d2;
      piVar1 = __errno_location();
    } while (*piVar1 == 4);
    if (config->file_clobber_mode == CLOBBER_NEVER) {
      __n = strlen(pcVar5);
      if (__n < 0xfffffffffffffff3) {
        pcVar3 = (char *)malloc(__n + 0xd);
        if (pcVar3 != (char *)0x0) {
          memcpy(pcVar3,pcVar5,__n);
          pcVar3[__n] = '.';
          __fd = -1;
          uVar4 = 1;
LAB_0010c27c:
          if (__fd == -1) {
            if (((*piVar1 != 0x11) && (*piVar1 != 0x15)) || (99 < uVar4)) {
              outs->filename = pcVar3;
              outs->alloc_filename = true;
              goto LAB_0010c203;
            }
            curl_msnprintf(pcVar3 + __n + 1,0xc,"%d",uVar4);
            uVar4 = uVar4 + 1;
            do {
              __fd = open64(pcVar3,0xc1,0x1b6);
              if (__fd != -1) break;
            } while (*piVar1 == 4);
            goto LAB_0010c27c;
          }
          outs->filename = pcVar3;
          outs->alloc_filename = true;
LAB_0010c1d2:
          pFVar2 = fdopen(__fd,"wb");
          if (pFVar2 != (FILE *)0x0) goto LAB_0010c1e5;
          close(__fd);
          goto LAB_0010c203;
        }
        pcVar5 = "out of memory";
      }
      else {
        pcVar5 = "overflow in filename generation";
      }
      errorf(config_00,pcVar5);
      return false;
    }
  }
LAB_0010c203:
  piVar1 = __errno_location();
  pcVar3 = strerror(*piVar1);
  warnf(config_00,"Failed to open the file %s: %s",pcVar5,pcVar3);
  return false;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs,
                             struct OperationConfig *config)
{
  struct GlobalConfig *global;
  FILE *file = NULL;
  const char *fname = outs->filename;
  DEBUGASSERT(outs);
  DEBUGASSERT(config);
  global = config->global;
  DEBUGASSERT(fname && *fname);

  if(config->file_clobber_mode == CLOBBER_ALWAYS ||
     (config->file_clobber_mode == CLOBBER_DEFAULT &&
      !outs->is_cd_filename)) {
    /* open file for writing */
    file = fopen(fname, "wb");
  }
  else {
    int fd;
    do {
      fd = open(fname, O_CREAT | O_WRONLY | O_EXCL | O_BINARY, OPENMODE);
      /* Keep retrying in the hope that it is not interrupted sometime */
    } while(fd == -1 && errno == EINTR);
    if(config->file_clobber_mode == CLOBBER_NEVER && fd == -1) {
      int next_num = 1;
      size_t len = strlen(fname);
      size_t newlen = len + 13; /* nul + 1-11 digits + dot */
      char *newname;
      /* Guard against wraparound in new filename */
      if(newlen < len) {
        errorf(global, "overflow in filename generation");
        return FALSE;
      }
      newname = malloc(newlen);
      if(!newname) {
        errorf(global, "out of memory");
        return FALSE;
      }
      memcpy(newname, fname, len);
      newname[len] = '.';
      while(fd == -1 && /* have not successfully opened a file */
            (errno == EEXIST || errno == EISDIR) &&
            /* because we keep having files that already exist */
            next_num < 100 /* and we have not reached the retry limit */ ) {
        msnprintf(newname + len + 1, 12, "%d", next_num);
        next_num++;
        do {
          fd = open(newname, O_CREAT | O_WRONLY | O_EXCL | O_BINARY, OPENMODE);
          /* Keep retrying in the hope that it is not interrupted sometime */
        } while(fd == -1 && errno == EINTR);
      }
      outs->filename = newname; /* remember the new one */
      outs->alloc_filename = TRUE;
    }
    /* An else statement to not overwrite existing files and not retry with
       new numbered names (which would cover
       config->file_clobber_mode == CLOBBER_DEFAULT && outs->is_cd_filename)
       is not needed because we would have failed earlier, in the while loop
       and `fd` would now be -1 */
    if(fd != -1) {
      file = fdopen(fd, "wb");
      if(!file)
        close(fd);
    }
  }

  if(!file) {
    warnf(global, "Failed to open the file %s: %s", fname,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}